

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

variables_map * validate_args(int ac,char **av)

{
  char *pcVar1;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar2;
  typed_value<unsigned_short,_char> *ptVar3;
  typed_value<long,_char> *ptVar4;
  typed_value<int,_char> *ptVar5;
  size_type sVar6;
  ostream *poVar7;
  char **in_RDX;
  undefined4 in_register_0000003c;
  variables_map *this;
  long local_100;
  basic_parsed_options<char> local_f8;
  int local_cc;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_c8;
  options_description desc;
  
  this = (variables_map *)CONCAT44(in_register_0000003c,ac);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"Allowed options",(allocator<char> *)&local_100);
  boost::program_options::options_description::options_description
            (&desc,(string *)&local_f8,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string((string *)&local_f8);
  local_f8.options.
  super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)boost::program_options::options_description::add_options();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_f8,"help,h");
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  ptVar2->m_required = true;
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"mcast,g",(char *)ptVar2);
  ptVar3 = boost::program_options::value<unsigned_short>();
  ptVar3->m_required = true;
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"udp-port,p",(char *)ptVar3);
  ptVar4 = boost::program_options::value<long>();
  local_100 = 0x3200000;
  ptVar4 = boost::program_options::typed_value<long,_char>::default_value(ptVar4,&local_100);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"max-space,b",(char *)ptVar4);
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  ptVar2->m_required = true;
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"shared-folder,f",(char *)ptVar2);
  ptVar5 = boost::program_options::value<int>();
  local_cc = 5;
  ptVar5 = boost::program_options::typed_value<int,_char>::default_value(ptVar5,&local_cc);
  boost::program_options::options_description_easy_init::operator()
            (pcVar1,(value_semantic *)"timeout,t",(char *)ptVar5);
  boost::program_options::variables_map::variables_map(this);
  local_c8.super_function_base.vtable = (vtable_base *)0x0;
  local_c8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_c8.super_function_base.functor._8_8_ = 0;
  local_c8.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>(&local_f8,(int)av,in_RDX,&desc,0,&local_c8);
  boost::program_options::store((basic_parsed_options *)&local_f8,this,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector(&local_f8.options);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"help",(allocator<char> *)&local_100);
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)(this + 0x10),(key_type *)&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  if (sVar6 == 0) {
    boost::program_options::notify(this);
    boost::program_options::options_description::~options_description(&desc);
    return this;
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"File store server");
  poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = (ostream *)boost::program_options::operator<<(poVar7,&desc);
  std::endl<char,std::char_traits<char>>(poVar7);
  exit(0);
}

Assistant:

po::variables_map validate_args(int ac, char **av) {
  boost::program_options::options_description desc("Allowed options");
  desc.add_options()
      ("help,h", "Help")
      ("mcast,g", po::value<std::string>()->required(), "Multicast address")
      ("udp-port,p", po::value<uint16_t>()->required(), "UDP port")
      ("max-space,b", po::value<long>()->default_value(52428800), "Max space in folder")
      ("shared-folder,f", po::value<std::string>()->required(), "Shared folder")
      ("timeout,t", po::value<int>()->default_value(5), "Wait timeout");
  po::variables_map vm;
  try {
    po::store(po::parse_command_line(ac, av, desc), vm);
    if (vm.count("help")) {
      std::cout << "File store server" << std::endl
                << desc << std::endl;
      exit(0);
    }
    po::notify(vm);
  } catch (po::error &e) {
    std::cerr << "ERROR: " << e.what() << std::endl << std::endl;
    std::cerr << desc << std::endl;
    exit(1);
  }
  return vm;
}